

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaIsBlank(xmlChar *str,int len)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  
  if (str != (xmlChar *)0x0) {
    if (len < 0) {
      while( true ) {
        uVar2 = (ulong)*str;
        if (0x20 < uVar2) {
          return 0;
        }
        if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) break;
        str = str + 1;
      }
      if (uVar2 != 0) {
        return 0;
      }
    }
    else {
      for (lVar3 = 0; (bVar1 = str[lVar3], bVar1 != 0 && (len != (int)lVar3)); lVar3 = lVar3 + 1) {
        if (0x20 < bVar1) {
          return 0;
        }
        if ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static int
xmlSchemaIsBlank(xmlChar * str, int len)
{
    if (str == NULL)
        return (1);
    if (len < 0) {
	while (*str != 0) {
	    if (!(IS_BLANK_CH(*str)))
		return (0);
	    str++;
	}
    } else while ((*str != 0) && (len != 0)) {
	if (!(IS_BLANK_CH(*str)))
	    return (0);
	str++;
	len--;
    }

    return (1);
}